

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O0

void __thiscall
QtPromisePrivate::
PromiseResolver<std::vector<QtPromise::QPromise<int>,std::allocator<QtPromise::QPromise<int>>>>::
resolve<std::vector<QtPromise::QPromise<int>,std::allocator<QtPromise::QPromise<int>>>&>
          (PromiseResolver<std::vector<QtPromise::QPromise<int>,std::allocator<QtPromise::QPromise<int>>>>
           *this,vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_> *value
          )

{
  QPromise<std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>_>
  *pQVar1;
  Data *pDVar2;
  PromiseData<std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>_>
  *pPVar3;
  QPromise<std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>_>
  *promise;
  vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_> *value_local;
  PromiseResolver<std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>_>
  *this_local;
  
  pDVar2 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>_>::Data>
           ::operator->((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>_>::Data>
                         *)this);
  pQVar1 = pDVar2->promise;
  if (pQVar1 != (QPromise<std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>_>
                 *)0x0) {
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>_>_>
             ::operator->(&(pQVar1->
                           super_QPromiseBase<std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>_>
                           ).m_d);
    PromiseData<std::vector<QtPromise::QPromise<int>,std::allocator<QtPromise::QPromise<int>>>>::
    resolve<std::vector<QtPromise::QPromise<int>,std::allocator<QtPromise::QPromise<int>>>&>
              ((PromiseData<std::vector<QtPromise::QPromise<int>,std::allocator<QtPromise::QPromise<int>>>>
                *)pPVar3,value);
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>_>_>
             ::operator->(&(pQVar1->
                           super_QPromiseBase<std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>_>
                           ).m_d);
    PromiseDataBase<std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>,_void_(const_std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>_&)>
    ::dispatch(&pPVar3->
                super_PromiseDataBase<std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>,_void_(const_std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>_&)>
              );
    PromiseResolver<std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>_>
    ::release((PromiseResolver<std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>_>
               *)this);
  }
  return;
}

Assistant:

void resolve(V&& value)
    {
        auto promise = m_d->promise;
        if (promise) {
            Q_ASSERT(promise->isPending());
            promise->m_d->resolve(std::forward<V>(value));
            promise->m_d->dispatch();
            release();
        }
    }